

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  int iVar1;
  WhereLoop *pWVar2;
  ulong uVar3;
  bool bVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  WhereTerm *pWVar7;
  ulong uVar8;
  WhereTerm *pWVar9;
  WhereTerm *pWVar10;
  
  BVar5 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pResultSet);
  if (pWInfo->pOrderBy != (ExprList *)0x0) {
    BVar6 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pOrderBy);
    BVar5 = BVar5 | BVar6;
  }
  uVar8 = (ulong)pWInfo->nLevel;
  BVar6 = 0xffffffffffffffff;
  if (1 < uVar8) {
    do {
      pWVar2 = pWInfo->a[uVar8 - 1].pWLoop;
      if (((pWInfo->pTabList->a[pWVar2->iTab].fg.jointype & 0x18) == 8) &&
         ((((pWInfo->wctrlFlags & 0x100) != 0 || ((pWVar2->wsFlags & 0x1000) != 0)) &&
          (uVar3 = pWVar2->maskSelf, (uVar3 & BVar5) == 0)))) {
        pWVar10 = (pWInfo->sWC).a;
        iVar1 = (pWInfo->sWC).nTerm;
        pWVar7 = pWVar10 + iVar1;
        pWVar9 = pWVar10;
        if (0 < (long)iVar1) {
          do {
            if (((pWVar9->prereqAll & uVar3) != 0) &&
               (((pWVar9->pExpr->flags & 1) == 0 ||
                ((pWVar9->pExpr->w).iJoin != pWInfo->pTabList->a[pWVar2->iTab].iCursor))))
            goto LAB_0019d90c;
            pWVar9 = pWVar9 + 1;
          } while (pWVar9 < pWVar7);
        }
        if (0 < iVar1) {
          do {
            if ((pWVar10->prereqAll & uVar3) != 0) {
              *(byte *)&pWVar10->wtFlags = (byte)pWVar10->wtFlags | 4;
            }
            pWVar10 = pWVar10 + 1;
          } while (pWVar10 < pWVar7);
        }
        if (uVar8 != pWInfo->nLevel) {
          memmove(pWInfo->a + (uVar8 - 1),pWInfo->a + uVar8,
                  (long)((ulong)((uint)pWInfo->nLevel - (int)uVar8) * 0x7000000000) >> 0x20);
        }
        BVar6 = BVar6 & ~uVar3;
        pWInfo->nLevel = pWInfo->nLevel + 0xff;
      }
LAB_0019d90c:
      bVar4 = 2 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar4);
  }
  return BVar6;
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}